

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
::raw_hash_set(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               *this,raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                     *that,allocator_type *a)

{
  BitMask<unsigned_short,_16,_0,_false> *pBVar1;
  bool bVar2;
  h2_t hVar3;
  uint32_t uVar4;
  size_t sVar5;
  hasher *hash_00;
  key_equal *eq;
  reference args;
  ctrl_t *ctrl_00;
  CommonFields *pCVar6;
  size_t sVar7;
  remove_const_t<slot_type>_conflict9 *prVar8;
  pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*> *ppVar9;
  CommonFields *pCVar10;
  NonIterableBitMask<unsigned_long,_8,_3> NVar11;
  BitMask<unsigned_short,_16,_0,_false> *pBVar12;
  GrowthInfo *this_00;
  h2_t *phVar13;
  const_iterator cVar14;
  FindInfo FVar15;
  iterator iVar16;
  ulong local_278;
  HashtablezInfoHandle local_1f9;
  ulong *local_1f8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  *prStack_1f0;
  size_t *local_1e8;
  size_t *psStack_1e0;
  ulong local_1d8;
  size_t shift;
  size_t offset;
  size_t cap;
  undefined1 auStack_1b8 [7];
  HashtablezInfoHandle infoz;
  size_t size;
  allocator_type *a_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  *that_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  *this_local;
  NonIterableBitMask<unsigned_short,_16,_0> local_13c;
  NonIterableBitMask<unsigned_short,_16,_0> local_13a;
  uint32_t i_1;
  BitMask<unsigned_short,_16,_0,_false> __end4_1;
  BitMask<unsigned_short,_16,_0,_false> __begin4_1;
  NonIterableBitMask<unsigned_short,_16,_0> local_122;
  NonIterableBitMask<unsigned_short,_16,_0> *local_120;
  BitMask<unsigned_short,_16,_0,_false> *__range4_1;
  size_t original_size_for_assert;
  size_t remaining;
  NonIterableBitMask<unsigned_long,_8,_3> NStack_100;
  uint32_t i;
  BitMask<unsigned_long,_8,_3,_false> __end4;
  BitMask<unsigned_long,_8,_3,_false> __begin4;
  BitMask<unsigned_long,_8,_3,_false> *__range4;
  NonIterableBitMask<unsigned_long,_8,_3> local_e0;
  BitMask<unsigned_long,_8,_3,_false> mask;
  ctrl_t *ctrl;
  size_t cap_1;
  HashElement local_a8;
  h2_t local_9a;
  HashtablezInfoHandle local_99;
  h2_t h2_1;
  size_t sStack_98;
  FindInfo target_1;
  size_t hash_1;
  HashElement local_50;
  h2_t local_42;
  HashtablezInfoHandle local_41;
  h2_t h2;
  size_t sStack_40;
  FindInfo target;
  size_t hash;
  
  sVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::size(that);
  sVar5 = GrowthToLowerboundCapacity(sVar5);
  hash_00 = hash_ref(that);
  eq = eq_ref(that);
  raw_hash_set(this,sVar5,hash_00,eq,a);
  AssertNotDebugCapacity(that);
  sVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::size(that);
  if (sVar5 != 0) {
    bVar2 = fits_in_soo(this,sVar5);
    if (bVar2) {
      if (sVar5 != 1) {
        __assert_fail("(size == 1) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xada,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::raw_hash_set(const raw_hash_set<Policy, Hash, Eq, Alloc> &, const allocator_type &) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                     );
      }
      pCVar6 = common(this);
      CommonFields::set_full_soo(pCVar6);
      iVar16 = soo_iterator(this);
      cVar14 = begin(that);
      _auStack_1b8 = cVar14.inner_.ctrl_;
      args = const_iterator::operator*((const_iterator *)auStack_1b8);
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
      ::
      emplace_at<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>const&>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                  *)this,iVar16,args);
      try_sample_soo(this);
      bVar2 = HashtablezInfoHandle::IsSampled((HashtablezInfoHandle *)((long)&cap + 7));
      if (bVar2) {
        resize_with_soo_infoz(this);
      }
    }
    else {
      bVar2 = is_soo(that);
      if (bVar2) {
        __assert_fail("(!that.is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xae1,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::raw_hash_set(const raw_hash_set<Policy, Hash, Eq, Alloc> &, const allocator_type &) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                     );
      }
      shift = capacity(this);
      offset = shift;
      bVar2 = is_single_group(shift);
      if (bVar2) {
        ctrl_00 = control(this);
        sVar7 = PerTableSalt(ctrl_00);
        local_278 = sVar7 | 1;
      }
      else {
        local_278 = 0;
      }
      local_1d8 = local_278;
      pCVar6 = common(that);
      cap_1 = (size_t)slot_array(that);
      local_1f8 = &local_1d8;
      local_1e8 = &shift;
      psStack_1e0 = &offset;
      prStack_1f0 = this;
      sVar7 = CommonFields::capacity(pCVar6);
      mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
           (NonIterableBitMask<unsigned_long,_8,_3>)CommonFields::control(pCVar6);
      bVar2 = is_small(sVar7);
      if (bVar2) {
        if (8 < sVar7) {
          __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x78b,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                       );
        }
        GroupPortableImpl::GroupPortableImpl
                  ((GroupPortableImpl *)&__range4,
                   (ctrl_t *)
                   ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + sVar7));
        local_e0.mask_ = (unsigned_long)GroupPortableImpl::MaskFull((GroupPortableImpl *)&__range4);
        mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
             (NonIterableBitMask<unsigned_long,_8,_3>)
             ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ - 1);
        __end4 = BitMask<unsigned_long,_8,_3,_false>::begin
                           ((BitMask<unsigned_long,_8,_3,_false> *)&local_e0);
        NStack_100.mask_ =
             (unsigned_long)
             BitMask<unsigned_long,_8,_3,_false>::end
                       ((BitMask<unsigned_long,_8,_3,_false> *)&local_e0);
        while (bVar2 = container_internal::operator!=
                                 (&__end4,(BitMask<unsigned_long,_8,_3,_false> *)
                                          &stack0xffffffffffffff00), bVar2) {
          remaining._4_4_ = BitMask<unsigned_long,_8,_3,_false>::operator*(&__end4);
          phVar13 = (h2_t *)((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                            (ulong)remaining._4_4_);
          prVar8 = (remove_const_t<slot_type>_conflict9 *)
                   (cap_1 + ((ulong)remaining._4_4_ - 1) * 0x10);
          if (local_1d8 == 0) {
            target.probe_length = (size_t)hash_ref(this);
            ppVar9 = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                     ::
                     element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                               (prVar8);
            sVar7 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                    ::
                    apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>::HashElement,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>&,absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                              ((HashElement *)&target.probe_length,ppVar9);
            pCVar6 = common(this);
            FVar15 = find_first_non_full_outofline(pCVar6,sVar7);
            target.offset = FVar15.probe_length;
            sStack_40 = FVar15.offset;
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::infoz(this);
            HashtablezInfoHandle::RecordInsert(&local_41,sVar7,target.offset);
          }
          local_42 = *phVar13;
          local_50.h = hash_ref(this);
          ppVar9 = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                   ::
                   element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                             (prVar8);
          sVar7 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                  ::
                  apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>::HashElement,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>&,absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                            (&local_50,ppVar9);
          hVar3 = H2(sVar7);
          if (hVar3 != local_42) {
            __assert_fail("(H2(PolicyTraits::apply(HashElement{hash_ref()}, PolicyTraits::element(that_slot))) == h2 && \"hash function value changed unexpectedly during the copy\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xb05,
                          "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::raw_hash_set(const raw_hash_set<FlatHashSetPolicy<pair<const Message *, const FieldDescriptor *>>, Hash<pair<const Message *, const FieldDescriptor *>>, equal_to<pair<const Message *, const FieldDescriptor *>>, allocator<pair<const Message *, const FieldDescriptor *>>> &, const allocator_type &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                         );
          }
          pCVar6 = common(this);
          SetCtrl(pCVar6,shift,local_42,0x10);
          iVar16 = iterator_at(this,shift);
          ppVar9 = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                   ::
                   element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                             (prVar8);
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
          ::
          emplace_at<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>&>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                      *)this,iVar16,ppVar9);
          pCVar6 = common(this);
          CommonFieldsGenerationInfoDisabled::maybe_increment_generation_on_insert
                    ((CommonFieldsGenerationInfoDisabled *)pCVar6);
          BitMask<unsigned_long,_8,_3,_false>::operator++(&__end4);
        }
      }
      else {
        __range4_1 = (BitMask<unsigned_short,_16,_0,_false> *)CommonFields::size(pCVar6);
        original_size_for_assert = (size_t)__range4_1;
        while (pBVar1 = __range4_1, original_size_for_assert != 0) {
          GroupSse2Impl::GroupSse2Impl
                    ((GroupSse2Impl *)&i_1,
                     (ctrl_t *)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_);
          local_122.mask_ = (unsigned_short)GroupSse2Impl::MaskFull((GroupSse2Impl *)&i_1);
          local_120 = &local_122;
          local_13a.mask_ =
               (unsigned_short)
               BitMask<unsigned_short,_16,_0,_false>::begin
                         ((BitMask<unsigned_short,_16,_0,_false> *)local_120);
          local_13c.mask_ =
               (unsigned_short)
               BitMask<unsigned_short,_16,_0,_false>::end
                         ((BitMask<unsigned_short,_16,_0,_false> *)local_120);
          while (bVar2 = container_internal::operator!=
                                   ((BitMask<unsigned_short,_16,_0,_false> *)&local_13a,
                                    (BitMask<unsigned_short,_16,_0,_false> *)&local_13c), bVar2) {
            uVar4 = BitMask<unsigned_short,_16,_0,_false>::operator*
                              ((BitMask<unsigned_short,_16,_0,_false> *)&local_13a);
            bVar2 = IsFull(*(ctrl_t *)
                            ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                            (ulong)uVar4));
            if (!bVar2) {
              __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x79d,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                           );
            }
            phVar13 = (h2_t *)((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                              (ulong)uVar4);
            prVar8 = (remove_const_t<slot_type>_conflict9 *)(cap_1 + (ulong)uVar4 * 0x10);
            if (local_1d8 == 0) {
              target_1.probe_length = (size_t)hash_ref(this);
              ppVar9 = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                       ::
                       element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                                 (prVar8);
              sVar7 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                      ::
                      apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>::HashElement,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>&,absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                                ((HashElement *)&target_1.probe_length,ppVar9);
              pCVar10 = common(this);
              FVar15 = find_first_non_full_outofline(pCVar10,sVar7);
              target_1.offset = FVar15.probe_length;
              sStack_98 = FVar15.offset;
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::infoz(this);
              HashtablezInfoHandle::RecordInsert(&local_99,sVar7,target_1.offset);
            }
            local_9a = *phVar13;
            local_a8.h = hash_ref(this);
            ppVar9 = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                     ::
                     element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                               (prVar8);
            sVar7 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                    ::
                    apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>::HashElement,std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>&,absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                              (&local_a8,ppVar9);
            hVar3 = H2(sVar7);
            if (hVar3 != local_9a) {
              __assert_fail("(H2(PolicyTraits::apply(HashElement{hash_ref()}, PolicyTraits::element(that_slot))) == h2 && \"hash function value changed unexpectedly during the copy\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xb05,
                            "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::raw_hash_set(const raw_hash_set<FlatHashSetPolicy<pair<const Message *, const FieldDescriptor *>>, Hash<pair<const Message *, const FieldDescriptor *>>, equal_to<pair<const Message *, const FieldDescriptor *>>, allocator<pair<const Message *, const FieldDescriptor *>>> &, const allocator_type &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                           );
            }
            pCVar10 = common(this);
            SetCtrl(pCVar10,shift,local_9a,0x10);
            iVar16 = iterator_at(this,shift);
            ppVar9 = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>
                     ::
                     element<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                               (prVar8);
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::
            emplace_at<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>&>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                        *)this,iVar16,ppVar9);
            pCVar10 = common(this);
            CommonFieldsGenerationInfoDisabled::maybe_increment_generation_on_insert
                      ((CommonFieldsGenerationInfoDisabled *)pCVar10);
            original_size_for_assert = original_size_for_assert - 1;
            BitMask<unsigned_short,_16,_0,_false>::operator++
                      ((BitMask<unsigned_short,_16,_0,_false> *)&local_13a);
          }
          NVar11 = mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + 0x10;
          cap_1 = cap_1 + 0x100;
          if ((original_size_for_assert == 0) ||
             (bVar2 = false,
             *(char *)((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + 0xf) != -1))
          {
            bVar2 = true;
          }
          mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
               (NonIterableBitMask<unsigned_long,_8,_3>)
               (NonIterableBitMask<unsigned_long,_8,_3>)NVar11.mask_;
          if (!bVar2) {
            __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7a5,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                         );
          }
        }
        pBVar12 = (BitMask<unsigned_short,_16,_0,_false> *)CommonFields::size(pCVar6);
        if (pBVar1 < pBVar12) {
          __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7aa,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:2801:9)]"
                       );
        }
      }
      if (local_1d8 != 0) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
        ::infoz(this);
        HashtablezInfoHandle::RecordStorageChanged(&local_1f9,sVar5,offset);
      }
      pCVar6 = common(this);
      CommonFields::set_size(pCVar6,sVar5);
      this_00 = growth_info(this);
      GrowthInfo::OverwriteManyEmptyAsFull(this_00,sVar5);
    }
  }
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
      : raw_hash_set(GrowthToLowerboundCapacity(that.size()), that.hash_ref(),
                     that.eq_ref(), a) {
    that.AssertNotDebugCapacity();
    const size_t size = that.size();
    if (size == 0) {
      return;
    }
    // We don't use `that.is_soo()` here because `that` can have non-SOO
    // capacity but have a size that fits into SOO capacity.
    if (fits_in_soo(size)) {
      ABSL_SWISSTABLE_ASSERT(size == 1);
      common().set_full_soo();
      emplace_at(soo_iterator(), *that.begin());
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) resize_with_soo_infoz(infoz);
      return;
    }
    ABSL_SWISSTABLE_ASSERT(!that.is_soo());
    const size_t cap = capacity();
    // Note about single group tables:
    // 1. It is correct to have any order of elements.
    // 2. Order has to be non deterministic.
    // 3. We are assigning elements with arbitrary `shift` starting from
    //    `capacity + shift` position.
    // 4. `shift` must be coprime with `capacity + 1` in order to be able to use
    //     modular arithmetic to traverse all positions, instead if cycling
    //     through a subset of positions. Odd numbers are coprime with any
    //     `capacity + 1` (2^N).
    size_t offset = cap;
    const size_t shift =
        is_single_group(cap) ? (PerTableSalt(control()) | 1) : 0;
    IterateOverFullSlots(
        that.common(), that.slot_array(),
        [&](const ctrl_t* that_ctrl,
            slot_type* that_slot) ABSL_ATTRIBUTE_ALWAYS_INLINE {
          if (shift == 0) {
            // Big tables case. Position must be searched via probing.
            // The table is guaranteed to be empty, so we can do faster than
            // a full `insert`.
            const size_t hash = PolicyTraits::apply(
                HashElement{hash_ref()}, PolicyTraits::element(that_slot));
            FindInfo target = find_first_non_full_outofline(common(), hash);
            infoz().RecordInsert(hash, target.probe_length);
            offset = target.offset;
          } else {
            // Small tables case. Next position is computed via shift.
            offset = (offset + shift) & cap;
          }
          const h2_t h2 = static_cast<h2_t>(*that_ctrl);
          ABSL_SWISSTABLE_ASSERT(  // We rely that hash is not changed for small
                                   // tables.
              H2(PolicyTraits::apply(HashElement{hash_ref()},
                                     PolicyTraits::element(that_slot))) == h2 &&
              "hash function value changed unexpectedly during the copy");
          SetCtrl(common(), offset, h2, sizeof(slot_type));
          emplace_at(iterator_at(offset), PolicyTraits::element(that_slot));
          common().maybe_increment_generation_on_insert();
        });
    if (shift != 0) {
      // On small table copy we do not record individual inserts.
      // RecordInsert requires hash, but it is unknown for small tables.
      infoz().RecordStorageChanged(size, cap);
    }
    common().set_size(size);
    growth_info().OverwriteManyEmptyAsFull(size);
  }